

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O1

bool nuraft::raft_server::apply_config_log_entry
               (ptr<log_entry> *le,ptr<state_mgr> *s_mgr,string *err_msg)

{
  log_val_type lVar1;
  log_entry *this;
  element_type *peVar2;
  buffer *this_00;
  long *plVar3;
  long *plVar4;
  char *pcVar5;
  char *pcVar6;
  uint __len;
  ptr<cluster_config> pVar7;
  ptr<cluster_config> new_conf;
  string __str;
  long *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  long local_58;
  _Alloc_hider _Stack_50;
  char *local_48 [2];
  char local_38 [16];
  
  this = (le->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((this == (log_entry *)0x0) ||
     ((s_mgr->super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0)) {
    pcVar6 = (char *)err_msg->_M_string_length;
    pcVar5 = "Invalid arguments";
  }
  else {
    if (this->value_type_ != conf) {
      lVar1 = this->value_type_;
      __len = 1;
      if (9 < lVar1) {
        __len = 3 - (lVar1 < 100);
      }
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct((ulong)local_48,(char)__len);
      std::__detail::__to_chars_10_impl<unsigned_int>(local_48[0],__len,(uint)lVar1);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x161b28);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_58 = *plVar4;
        _Stack_50._M_p = (pointer)plVar3[3];
        local_68 = &local_58;
      }
      else {
        local_58 = *plVar4;
        local_68 = (long *)*plVar3;
      }
      local_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::operator=((string *)err_msg,(string *)&local_68);
      if (local_68 != &local_58) {
        operator_delete(local_68);
      }
      if (local_48[0] != local_38) {
        operator_delete(local_48[0]);
      }
      return false;
    }
    if ((this->buff_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      this_00 = log_entry::get_buf(this);
      buffer::pos(this_00,0);
      pVar7 = cluster_config::deserialize((cluster_config *)&local_68,this_00);
      peVar2 = (s_mgr->super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (*peVar2->_vptr_state_mgr[3])
                (peVar2,local_68,
                 pVar7.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._M_pi);
      if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
      }
      return true;
    }
    pcVar6 = (char *)err_msg->_M_string_length;
    pcVar5 = "Context is empty";
  }
  std::__cxx11::string::_M_replace((ulong)err_msg,0,pcVar6,(ulong)pcVar5);
  return false;
}

Assistant:

bool raft_server::apply_config_log_entry(ptr<log_entry>& le,
                                         ptr<state_mgr>& s_mgr,
                                         std::string& err_msg)
{
    if (!le.get() || !s_mgr.get()) {
        err_msg = "Invalid arguments";
        return false;
    }
    if (le->get_val_type() != log_val_type::conf) {
        err_msg = "Invalid log type: " + std::to_string(le->get_val_type());
        return false;
    }
    if (le->is_buf_null()) {
        err_msg = "Context is empty";
        return false;
    }

    buffer& buf = le->get_buf();
    buf.pos(0);
    ptr<cluster_config> new_conf = cluster_config::deserialize(buf);
    s_mgr->save_config(*new_conf);
    return true;
}